

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadjointcheckpointscheme_fixed.c
# Opt level: O1

SUNErrCode SUNAdjointCheckpointScheme_Destroy_Fixed(SUNAdjointCheckpointScheme *self_ptr)

{
  SUNAdjointCheckpointScheme __ptr;
  
  __ptr = *self_ptr;
  SUNDataNode_Destroy((long)__ptr->content + 0x28);
  free(__ptr->content);
  free(__ptr->ops);
  free(__ptr);
  *self_ptr = (SUNAdjointCheckpointScheme)0x0;
  return 0;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_Destroy_Fixed(
  SUNAdjointCheckpointScheme* self_ptr)
{
  SUNFunctionBegin((*self_ptr)->sunctx);

  SUNAdjointCheckpointScheme self = *self_ptr;

  SUNCheckCall(SUNDataNode_Destroy(&IMPL_MEMBER(self, root_node)));

  free(self->content);
  free(self->ops);
  free(self);

  *self_ptr = NULL;

  return SUN_SUCCESS;
}